

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

IXML_NodeList * ixmlNode_getChildNodes(IXML_Node_conflict *nodeptr)

{
  int iVar1;
  IXML_Node_conflict *pIStack_28;
  int rc;
  IXML_NodeList *newNodeList;
  IXML_Node_conflict *tempNode;
  IXML_Node_conflict *nodeptr_local;
  
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    nodeptr_local = (IXML_Node_conflict *)0x0;
  }
  else {
    tempNode = nodeptr;
    pIStack_28 = (IXML_Node_conflict *)malloc(0x10);
    if (pIStack_28 == (IXML_Node_conflict *)0x0) {
      nodeptr_local = (IXML_Node_conflict *)0x0;
    }
    else {
      ixmlNodeList_init((IXML_NodeList *)pIStack_28);
      for (newNodeList = (IXML_NodeList *)tempNode->firstChild; newNodeList != (IXML_NodeList *)0x0;
          newNodeList = (IXML_NodeList *)newNodeList[5].nodeItem) {
        iVar1 = ixmlNodeList_addToNodeList
                          ((IXML_NodeList **)&stack0xffffffffffffffd8,
                           (IXML_Node_conflict *)newNodeList);
        if (iVar1 != 0) {
          ixmlNodeList_free((IXML_NodeList *)pIStack_28);
          return (IXML_NodeList *)0x0;
        }
      }
      nodeptr_local = pIStack_28;
    }
  }
  return (IXML_NodeList *)nodeptr_local;
}

Assistant:

IXML_NodeList *ixmlNode_getChildNodes(IXML_Node *nodeptr)
{
	IXML_Node *tempNode;
	IXML_NodeList *newNodeList;
	int rc;

	if (nodeptr == NULL) {
		return NULL;
	}

	newNodeList = (IXML_NodeList *)malloc(sizeof(IXML_NodeList));
	if (newNodeList == NULL) {
		return NULL;
	}

	ixmlNodeList_init(newNodeList);
	tempNode = nodeptr->firstChild;
	while (tempNode != NULL) {
		rc = ixmlNodeList_addToNodeList(&newNodeList, tempNode);
		if (rc != IXML_SUCCESS) {
			ixmlNodeList_free(newNodeList);
			return NULL;
		}

		tempNode = tempNode->nextSibling;
	}

	return newNodeList;
}